

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::base::utils::RegistryWithPred<el::Configuration,_el::Configuration::Predicate>::deepCopy
          (RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *this,
          AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
          *sr)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Configuration *this_00;
  undefined8 *puVar2;
  
  iVar1 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])(sr);
  puVar2 = *(undefined8 **)CONCAT44(extraout_var,iVar1);
  while( true ) {
    iVar1 = (*(sr->super_ThreadSafe)._vptr_ThreadSafe[0xc])(sr);
    if (puVar2 == *(undefined8 **)(CONCAT44(extraout_var_00,iVar1) + 8)) break;
    this_00 = (Configuration *)operator_new(0x30);
    Configuration::Configuration(this_00,(Configuration *)*puVar2);
    (*(this->
      super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      ).super_ThreadSafe._vptr_ThreadSafe[0x10])(this,this_00);
    puVar2 = puVar2 + 1;
  }
  return;
}

Assistant:

virtual void deepCopy(const AbstractRegistry<T_Ptr, std::vector<T_Ptr*>>& sr) {
    for (const_iterator it = sr.list().begin(); it != sr.list().end(); ++it) {
      registerNew(new T_Ptr(**it));
    }
  }